

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O0

int ClipSegmentToLine(ClipVertex *vOut,ClipVertex *vIn,btVector3 *normal,btScalar offset)

{
  undefined8 *puVar1;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  undefined8 *in_RDI;
  float in_XMM0_Da;
  btScalar bVar2;
  float fVar3;
  btVector3 bVar4;
  btScalar interp;
  btScalar distance1;
  btScalar distance0;
  int numOut;
  btVector3 *v;
  undefined4 in_stack_ffffffffffffffa0;
  btVector3 *in_stack_ffffffffffffffa8;
  btVector3 *v2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 local_3c;
  undefined8 local_34;
  uint local_20;
  
  bVar2 = btVector3::dot(in_RDX,in_RSI);
  fVar3 = bVar2 - in_XMM0_Da;
  bVar2 = btVector3::dot(in_RDX,(btVector3 *)(in_RSI[1].m_floats + 1));
  if (fVar3 <= 0.0) {
    *in_RDI = *(undefined8 *)in_RSI->m_floats;
    in_RDI[1] = *(undefined8 *)(in_RSI->m_floats + 2);
    *(btScalar *)(in_RDI + 2) = in_RSI[1].m_floats[0];
  }
  local_20 = (uint)(fVar3 <= 0.0);
  if (bVar2 - in_XMM0_Da <= 0.0) {
    puVar1 = (undefined8 *)((long)in_RDI + (long)(int)local_20 * 0x14);
    *puVar1 = *(undefined8 *)(in_RSI[1].m_floats + 1);
    puVar1[1] = *(undefined8 *)(in_RSI[1].m_floats + 3);
    *(btScalar *)(puVar1 + 2) = in_RSI[2].m_floats[1];
    local_20 = local_20 + 1;
  }
  if (fVar3 * (bVar2 - in_XMM0_Da) < 0.0) {
    v = in_RSI;
    bVar4 = operator-((btVector3 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8);
    v2 = bVar4.m_floats._4_8_;
    bVar2 = bVar4.m_floats[3];
    bVar4 = operator*((btScalar *)CONCAT44(bVar4.m_floats[0],in_stack_ffffffffffffffa0),v);
    bVar4 = operator+((btVector3 *)CONCAT44(bVar4.m_floats[0],bVar2),v2);
    puVar1 = (undefined8 *)((long)in_RDI + (long)(int)local_20 * 0x14);
    local_3c = bVar4.m_floats._0_8_;
    *puVar1 = local_3c;
    local_34 = bVar4.m_floats._8_8_;
    puVar1[1] = local_34;
    if (fVar3 <= 0.0) {
      *(btScalar *)((long)in_RDI + (long)(int)local_20 * 0x14 + 0x10) = in_RSI[2].m_floats[1];
    }
    else {
      *(btScalar *)((long)in_RDI + (long)(int)local_20 * 0x14 + 0x10) = in_RSI[1].m_floats[0];
    }
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

static int ClipSegmentToLine(ClipVertex vOut[2], ClipVertex vIn[2],
					  const btVector3& normal, btScalar offset)
{
	// Start with no output points
	int numOut = 0;

	// Calculate the distance of end points to the line
	btScalar distance0 = b2Dot(normal, vIn[0].v) - offset;
	btScalar distance1 = b2Dot(normal, vIn[1].v) - offset;

	// If the points are behind the plane
	if (distance0 <= 0.0f) vOut[numOut++] = vIn[0];
	if (distance1 <= 0.0f) vOut[numOut++] = vIn[1];

	// If the points are on different sides of the plane
	if (distance0 * distance1 < 0.0f)
	{
		// Find intersection point of edge and plane
		btScalar interp = distance0 / (distance0 - distance1);
		vOut[numOut].v = vIn[0].v + interp * (vIn[1].v - vIn[0].v);
		if (distance0 > 0.0f)
		{
			vOut[numOut].id = vIn[0].id;
		}
		else
		{
			vOut[numOut].id = vIn[1].id;
		}
		++numOut;
	}

	return numOut;
}